

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall
llvm::Triple::Triple
          (Triple *this,Twine *ArchStr,Twine *VendorStr,Twine *OSStr,Twine *EnvironmentStr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringRef ArchName;
  StringRef SubArchName;
  StringRef VendorName;
  StringRef OSName;
  StringRef EnvironmentName;
  StringRef EnvironmentName_00;
  Twine *this_00;
  NodeKind NVar2;
  ArchType AVar3;
  SubArchType SVar4;
  VendorType VVar5;
  OSType OVar6;
  EnvironmentType EVar7;
  ObjectFormatType OVar8;
  NodeKind NVar9;
  Child CVar10;
  Child CVar11;
  NodeKind NVar12;
  Child local_e8;
  uint uStack_e0;
  undefined4 uStack_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Twine *local_c0;
  Child local_b8;
  uint uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  Child local_98;
  uint uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  Child local_80;
  uint uStack_78;
  undefined4 uStack_74;
  NodeKind local_70;
  char cStack_6f;
  undefined6 uStack_6e;
  Child local_68;
  uint uStack_60;
  undefined4 uStack_5c;
  NodeKind local_58;
  char cStack_57;
  undefined6 uStack_56;
  Child local_50;
  uint uStack_48;
  undefined4 uStack_44;
  NodeKind local_40;
  char cStack_3f;
  undefined6 uStack_3e;
  Twine *local_38;
  
  NVar2 = ArchStr->LHSKind;
  local_c0 = ArchStr;
  if (NVar2 == EmptyKind) {
    local_80 = (Child)0x2d;
    local_70 = CharKind;
    cStack_6f = '\x01';
    NVar2 = VendorStr->LHSKind;
    if (NVar2 == NullKind) goto LAB_001a81ed;
LAB_001a81f6:
    if (NVar2 == EmptyKind) {
      local_a8 = CONCAT62(uStack_6e,CONCAT11(cStack_6f,local_70));
      local_b8.decUI = local_80.decUI;
      local_b8._4_4_ = local_80._4_4_;
      uStack_b0 = uStack_78;
      uStack_ac = uStack_74;
    }
    else {
      CVar11 = local_80;
      NVar9 = local_70;
      if (cStack_6f != '\x01') {
        CVar11.twine = (Twine *)&local_80;
        NVar9 = TwineKind;
      }
      CVar10.twine = VendorStr;
      NVar12 = TwineKind;
      if (VendorStr->RHSKind == EmptyKind) {
        CVar10 = VendorStr->LHS;
        NVar12 = NVar2;
      }
      Twine::Twine((Twine *)&local_b8,CVar11,NVar9,CVar10,NVar12);
    }
  }
  else {
    if (NVar2 == NullKind) {
      local_70 = NullKind;
      cStack_6f = '\x01';
    }
    else {
      CVar11.twine = ArchStr;
      NVar9 = TwineKind;
      if (ArchStr->RHSKind == EmptyKind) {
        CVar11 = ArchStr->LHS;
        NVar9 = NVar2;
      }
      Twine::Twine((Twine *)&local_80,CVar11,NVar9,(Child)0x2d,CharKind);
      if ((local_70 != NullKind) && (NVar2 = VendorStr->LHSKind, NVar2 != NullKind)) {
        if (local_70 != EmptyKind) goto LAB_001a81f6;
        local_a8._0_1_ = VendorStr->LHSKind;
        local_a8._1_1_ = VendorStr->RHSKind;
        local_a8._2_6_ = *(undefined6 *)&VendorStr->field_0x12;
        local_b8.decUI = (VendorStr->LHS).decUI;
        local_b8._4_4_ = *(undefined4 *)((long)&VendorStr->LHS + 4);
        uStack_b0 = (VendorStr->RHS).decUI;
        uStack_ac = *(undefined4 *)((long)&VendorStr->RHS + 4);
        goto LAB_001a8251;
      }
    }
LAB_001a81ed:
    local_a8 = CONCAT62(local_a8._2_6_,0x100);
  }
LAB_001a8251:
  if ((NodeKind)local_a8 == EmptyKind) {
    local_68 = (Child)0x2d;
    local_58 = CharKind;
    cStack_57 = '\x01';
    NVar2 = OSStr->LHSKind;
    if (NVar2 == NullKind) goto LAB_001a82e6;
LAB_001a82ef:
    if (NVar2 == EmptyKind) {
      local_88 = CONCAT62(uStack_56,CONCAT11(cStack_57,local_58));
      local_98.decUI = local_68.decUI;
      local_98._4_4_ = local_68._4_4_;
      uStack_90 = uStack_60;
      uStack_8c = uStack_5c;
    }
    else {
      CVar11 = local_68;
      NVar9 = local_58;
      if (cStack_57 != '\x01') {
        CVar11.twine = (Twine *)&local_68;
        NVar9 = TwineKind;
      }
      CVar10.twine = OSStr;
      NVar12 = TwineKind;
      if (OSStr->RHSKind == EmptyKind) {
        CVar10 = OSStr->LHS;
        NVar12 = NVar2;
      }
      Twine::Twine((Twine *)&local_98,CVar11,NVar9,CVar10,NVar12);
    }
  }
  else {
    if ((NodeKind)local_a8 == NullKind) {
      local_58 = NullKind;
      cStack_57 = '\x01';
    }
    else {
      NVar2 = TwineKind;
      if (local_a8._1_1_ == '\x01') {
        NVar2 = (NodeKind)local_a8;
      }
      CVar11._4_4_ = local_b8._4_4_;
      CVar11.decUI = local_b8.decUI;
      CVar10.twine = (Twine *)&local_b8;
      if (local_a8._1_1_ == '\x01') {
        CVar10 = CVar11;
      }
      Twine::Twine((Twine *)&local_68,CVar10,NVar2,(Child)0x2d,CharKind);
      if ((local_58 != NullKind) && (NVar2 = OSStr->LHSKind, NVar2 != NullKind)) {
        if (local_58 != EmptyKind) goto LAB_001a82ef;
        local_88._0_1_ = OSStr->LHSKind;
        local_88._1_1_ = OSStr->RHSKind;
        local_88._2_6_ = *(undefined6 *)&OSStr->field_0x12;
        local_98.decUI = (OSStr->LHS).decUI;
        local_98._4_4_ = *(undefined4 *)((long)&OSStr->LHS + 4);
        uStack_90 = (OSStr->RHS).decUI;
        uStack_8c = *(undefined4 *)((long)&OSStr->RHS + 4);
        goto LAB_001a8351;
      }
    }
LAB_001a82e6:
    local_88 = CONCAT62(local_88._2_6_,0x100);
  }
LAB_001a8351:
  local_38 = EnvironmentStr;
  if ((NodeKind)local_88 == EmptyKind) {
    local_50 = (Child)0x2d;
    local_40 = CharKind;
    cStack_3f = '\x01';
    NVar2 = EnvironmentStr->LHSKind;
    if (NVar2 != NullKind) {
LAB_001a8402:
      if (NVar2 == EmptyKind) {
        local_d8._M_allocated_capacity = CONCAT62(uStack_3e,CONCAT11(cStack_3f,local_40));
        local_e8.decUI = local_50.decUI;
        local_e8._4_4_ = local_50._4_4_;
        uStack_e0 = uStack_48;
        uStack_dc = uStack_44;
      }
      else {
        CVar11 = local_50;
        NVar9 = local_40;
        if (cStack_3f != '\x01') {
          CVar11.twine = (Twine *)&local_50;
          NVar9 = TwineKind;
        }
        NVar12 = TwineKind;
        if (EnvironmentStr->RHSKind == EmptyKind) {
          EnvironmentStr = *(Twine **)&EnvironmentStr->LHS;
          NVar12 = NVar2;
        }
        Twine::Twine((Twine *)&local_e8,CVar11,NVar9,(Child)EnvironmentStr,NVar12);
      }
      goto LAB_001a8467;
    }
  }
  else if ((NodeKind)local_88 == NullKind) {
    local_40 = NullKind;
    cStack_3f = '\x01';
  }
  else {
    NVar2 = TwineKind;
    if (local_88._1_1_ == '\x01') {
      NVar2 = (NodeKind)local_88;
    }
    CVar10._4_4_ = local_98._4_4_;
    CVar10.decUI = local_98.decUI;
    CVar11.twine = (Twine *)&local_98;
    if (local_88._1_1_ == '\x01') {
      CVar11 = CVar10;
    }
    Twine::Twine((Twine *)&local_50,CVar11,NVar2,(Child)0x2d,CharKind);
    if ((local_40 != NullKind) && (NVar2 = EnvironmentStr->LHSKind, NVar2 != NullKind)) {
      if (local_40 == EmptyKind) {
        local_d8._0_1_ = EnvironmentStr->LHSKind;
        local_d8._1_1_ = EnvironmentStr->RHSKind;
        local_d8._M_allocated_capacity._2_6_ = *(undefined6 *)&EnvironmentStr->field_0x12;
        local_e8.decUI = (EnvironmentStr->LHS).decUI;
        local_e8._4_4_ = *(undefined4 *)((long)&EnvironmentStr->LHS + 4);
        uStack_e0 = (EnvironmentStr->RHS).decUI;
        uStack_dc = *(undefined4 *)((long)&EnvironmentStr->RHS + 4);
        goto LAB_001a8467;
      }
      goto LAB_001a8402;
    }
  }
  local_d8._M_allocated_capacity._0_2_ = 0x100;
LAB_001a8467:
  Twine::str_abi_cxx11_(&this->Data,(Twine *)&local_e8);
  Twine::str_abi_cxx11_((string *)&local_e8,local_c0);
  ArchName.Data._4_4_ = local_e8._4_4_;
  ArchName.Data._0_4_ = local_e8.decUI;
  ArchName.Length._0_4_ = uStack_e0;
  ArchName.Length._4_4_ = uStack_dc;
  AVar3 = parseArch(ArchName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e8._4_4_,local_e8.decUI) != &local_d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_e8._4_4_,local_e8.decUI),local_d8._M_allocated_capacity + 1);
  }
  this->Arch = AVar3;
  Twine::str_abi_cxx11_((string *)&local_e8,local_c0);
  SubArchName.Data._4_4_ = local_e8._4_4_;
  SubArchName.Data._0_4_ = local_e8.decUI;
  SubArchName.Length._0_4_ = uStack_e0;
  SubArchName.Length._4_4_ = uStack_dc;
  SVar4 = parseSubArch(SubArchName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e8._4_4_,local_e8.decUI) != &local_d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_e8._4_4_,local_e8.decUI),local_d8._M_allocated_capacity + 1);
  }
  this->SubArch = SVar4;
  Twine::str_abi_cxx11_((string *)&local_e8,VendorStr);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_e8._4_4_,local_e8.decUI);
  VendorName.Data._4_4_ = local_e8._4_4_;
  VendorName.Data._0_4_ = local_e8.decUI;
  VendorName.Length._0_4_ = uStack_e0;
  VendorName.Length._4_4_ = uStack_dc;
  VVar5 = parseVendor(VendorName);
  if (paVar1 != &local_d8) {
    operator_delete(paVar1,local_d8._M_allocated_capacity + 1);
  }
  this->Vendor = VVar5;
  Twine::str_abi_cxx11_((string *)&local_e8,OSStr);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_e8._4_4_,local_e8.decUI);
  OSName.Data._4_4_ = local_e8._4_4_;
  OSName.Data._0_4_ = local_e8.decUI;
  OSName.Length._0_4_ = uStack_e0;
  OSName.Length._4_4_ = uStack_dc;
  OVar6 = parseOS(OSName);
  if (paVar1 != &local_d8) {
    operator_delete(paVar1,local_d8._M_allocated_capacity + 1);
  }
  this_00 = local_38;
  this->OS = OVar6;
  Twine::str_abi_cxx11_((string *)&local_e8,local_38);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_e8._4_4_,local_e8.decUI);
  EnvironmentName.Data._4_4_ = local_e8._4_4_;
  EnvironmentName.Data._0_4_ = local_e8.decUI;
  EnvironmentName.Length._0_4_ = uStack_e0;
  EnvironmentName.Length._4_4_ = uStack_dc;
  EVar7 = parseEnvironment(EnvironmentName);
  if (paVar1 != &local_d8) {
    operator_delete(paVar1,local_d8._M_allocated_capacity + 1);
  }
  this->Environment = EVar7;
  Twine::str_abi_cxx11_((string *)&local_e8,this_00);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_e8._4_4_,local_e8.decUI);
  EnvironmentName_00.Data._4_4_ = local_e8._4_4_;
  EnvironmentName_00.Data._0_4_ = local_e8.decUI;
  EnvironmentName_00.Length._0_4_ = uStack_e0;
  EnvironmentName_00.Length._4_4_ = uStack_dc;
  OVar8 = parseFormat(EnvironmentName_00);
  if (paVar1 != &local_d8) {
    operator_delete(paVar1,local_d8._M_allocated_capacity + 1);
  }
  this->ObjectFormat = OVar8;
  if (OVar8 == UnknownObjectFormat) {
    OVar8 = getDefaultFormat((Triple *)(ulong)this->Arch);
    this->ObjectFormat = OVar8;
  }
  return;
}

Assistant:

Triple::Triple(const Twine &ArchStr, const Twine &VendorStr, const Twine &OSStr,
               const Twine &EnvironmentStr)
    : Data((ArchStr + Twine('-') + VendorStr + Twine('-') + OSStr + Twine('-') +
            EnvironmentStr).str()),
      Arch(parseArch(ArchStr.str())),
      SubArch(parseSubArch(ArchStr.str())),
      Vendor(parseVendor(VendorStr.str())),
      OS(parseOS(OSStr.str())),
      Environment(parseEnvironment(EnvironmentStr.str())),
      ObjectFormat(parseFormat(EnvironmentStr.str())) {
  if (ObjectFormat == Triple::UnknownObjectFormat)
    ObjectFormat = getDefaultFormat(*this);
}